

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionInfoArray __thiscall
Js::ParseableFunctionInfo::GetNestedFuncArray(ParseableFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  NestedArray *pNVar4;
  
  pNVar4 = (this->nestedArray).ptr;
  if (pNVar4 == (NestedArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7dc,"(GetNestedArray() != nullptr)","GetNestedArray() != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pNVar4 = (this->nestedArray).ptr;
  }
  return (FunctionInfoArray)(pNVar4 + 1);
}

Assistant:

FunctionInfoArray ParseableFunctionInfo::GetNestedFuncArray()
    {
        Assert(GetNestedArray() != nullptr);
        return GetNestedArray()->functionInfoArray;
    }